

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellANCF_3833.cpp
# Opt level: O3

ChMatrix33<double> * __thiscall
chrono::fea::ChElementShellANCF_3833::GetPK2Stress
          (ChMatrix33<double> *__return_storage_ptr__,ChElementShellANCF_3833 *this,double layer,
          double xi,double eta,double layer_zeta)

{
  double *pdVar1;
  double *pdVar2;
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  long lVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  double *pdVar23;
  double *pdVar24;
  double *pdVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  ChKblockGeneric *pCVar31;
  double *pdVar32;
  Index row;
  long lVar33;
  pointer pLVar34;
  ChElementShellANCF_3833 *this_00;
  ActualDstType actualDst;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  double dVar52;
  undefined1 auVar53 [16];
  double dVar55;
  undefined1 auVar54 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [32];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  ChMatrixNMc<double,_3,_3> F;
  ChVectorN<double,_6> sigmaPK2;
  ChMatrix33<double> J_0xi;
  ChMatrixNM<double,_6,_6> D;
  Matrix3xN e_bar;
  MatrixNx3c Sxi_D;
  undefined1 local_900 [16];
  double local_8f0;
  double dStack_8e8;
  undefined1 local_8e0 [32];
  Matrix<double,_3,_3,_0,_3,_3> local_8c0;
  undefined1 local_860 [16];
  Scalar local_848;
  Matrix<double,_3,_3,_0,_3,_3> local_840;
  Matrix<double,_3,_3,_1,_3,_3> local_7c0;
  undefined1 local_740 [592];
  double local_4f0;
  double local_4e8;
  double local_4e0;
  double local_4d8;
  double local_4d0;
  double local_4c8;
  double local_4c0;
  double local_4b8;
  MatrixNx3c *local_4b0;
  Matrix<double,_3,_3,_1,_3,_3> *local_4a8;
  double local_4a0;
  undefined1 local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined1 local_180 [64];
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  
  auVar49._8_56_ = in_register_00001208;
  auVar49._0_8_ = layer;
  lVar33 = vcvttsd2usi_avx512f(auVar49._0_16_);
  dVar52 = (this->m_layers).
           super__Vector_base<chrono::fea::ChElementShellANCF_3833::Layer,_Eigen::aligned_allocator<chrono::fea::ChElementShellANCF_3833::Layer>_>
           ._M_impl.super__Vector_impl_data._M_start[lVar33].m_thickness;
  Calc_Sxi_D(this,(MatrixNx3c *)local_2c0,xi,eta,layer_zeta,dVar52,
             ((this->m_layer_zoffsets).super__Vector_base<double,_Eigen::aligned_allocator<double>_>
              ._M_impl.super__Vector_impl_data._M_start[lVar33] - this->m_thicknessZ * 0.5) +
             dVar52 * 0.5 + this->m_midsurfoffset);
  local_740._576_8_ = 1.0;
  local_7c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       0.0;
  local_7c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       0.0;
  local_7c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       0.0;
  local_7c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       0.0;
  local_7c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
       0.0;
  local_7c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       0.0;
  local_7c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       0.0;
  local_7c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
       0.0;
  local_7c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
       0.0;
  Eigen::internal::
  generic_product_impl<Eigen::Matrix<double,3,24,1,3,24>,Eigen::Matrix<double,24,3,0,24,3>,Eigen::DenseShape,Eigen::DenseShape,8>
  ::scaleAndAddTo<Eigen::Matrix<double,3,3,1,3,3>>
            (&local_7c0,&this->m_ebar0,(MatrixNx3c *)local_2c0,(Scalar *)(local_740 + 0x240));
  local_740._0_8_ = (MatrixNx3c *)local_2c0;
  local_740._8_8_ = &local_7c0;
  local_740._576_8_ = (MatrixNx3c *)local_2c0;
  Eigen::internal::
  Assignment<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Inverse<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
  ::run((Matrix<double,_3,_3,_1,_3,_3> *)(local_740 + 0x248),(SrcXprType *)(local_740 + 8),
        (assign_op<double,_double> *)&local_8c0);
  local_4b0 = (MatrixNx3c *)local_740._576_8_;
  local_4a0 = 1.48219693752374e-323;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = local_740._584_8_;
  auVar38 = vbroadcastsd_avx512f(auVar35);
  auVar49 = *(undefined1 (*) [64])
             (((PlainObjectBase<Eigen::Matrix<double,_24,_3,_0,_24,_3>_> *)local_740._576_8_)->
             m_storage).m_data.array;
  auVar50 = *(undefined1 (*) [64])
             ((((PlainObjectBase<Eigen::Matrix<double,_24,_3,_0,_24,_3>_> *)local_740._576_8_)->
              m_storage).m_data.array + 8);
  auVar51 = *(undefined1 (*) [64])
             ((((PlainObjectBase<Eigen::Matrix<double,_24,_3,_0,_24,_3>_> *)local_740._576_8_)->
              m_storage).m_data.array + 0x10);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = local_4e0;
  auVar39 = vbroadcastsd_avx512f(auVar9);
  auVar3 = *(undefined1 (*) [64])
            ((((PlainObjectBase<Eigen::Matrix<double,_24,_3,_0,_24,_3>_> *)local_740._576_8_)->
             m_storage).m_data.array + 0x18);
  auVar4 = *(undefined1 (*) [64])
            ((((PlainObjectBase<Eigen::Matrix<double,_24,_3,_0,_24,_3>_> *)local_740._576_8_)->
             m_storage).m_data.array + 0x20);
  auVar5 = *(undefined1 (*) [64])
            ((((PlainObjectBase<Eigen::Matrix<double,_24,_3,_0,_24,_3>_> *)local_740._576_8_)->
             m_storage).m_data.array + 0x28);
  auVar36._8_8_ = 0;
  auVar36._0_8_ = local_4f0;
  auVar40 = vbroadcastsd_avx512f(auVar36);
  auVar37._8_8_ = 0;
  auVar37._0_8_ = local_4c8;
  auVar41 = vbroadcastsd_avx512f(auVar37);
  auVar6 = *(undefined1 (*) [64])
            ((((PlainObjectBase<Eigen::Matrix<double,_24,_3,_0,_24,_3>_> *)local_740._576_8_)->
             m_storage).m_data.array + 0x30);
  auVar7 = *(undefined1 (*) [64])
            ((((PlainObjectBase<Eigen::Matrix<double,_24,_3,_0,_24,_3>_> *)local_740._576_8_)->
             m_storage).m_data.array + 0x38);
  auVar8 = *(undefined1 (*) [64])
            ((((PlainObjectBase<Eigen::Matrix<double,_24,_3,_0,_24,_3>_> *)local_740._576_8_)->
             m_storage).m_data.array + 0x40);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = local_4d8;
  auVar42 = vbroadcastsd_avx512f(auVar10);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = local_4d0;
  auVar43 = vbroadcastsd_avx512f(auVar11);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = local_4c0;
  auVar44 = vbroadcastsd_avx512f(auVar12);
  auVar45 = vmulpd_avx512f(auVar49,auVar38);
  auVar46 = vmulpd_avx512f(auVar38,auVar50);
  auVar38 = vmulpd_avx512f(auVar38,auVar51);
  auVar47 = vmulpd_avx512f(auVar49,auVar40);
  auVar48 = vmulpd_avx512f(auVar50,auVar40);
  auVar45 = vfmadd231pd_avx512f(auVar45,auVar3,auVar39);
  auVar46 = vfmadd231pd_avx512f(auVar46,auVar4,auVar39);
  auVar38 = vfmadd231pd_avx512f(auVar38,auVar5,auVar39);
  auVar39 = vfmadd231pd_avx512f(auVar47,auVar3,auVar42);
  auVar47 = vfmadd231pd_avx512f(auVar48,auVar4,auVar42);
  local_2c0 = vfmadd231pd_avx512f(auVar45,auVar6,auVar41);
  local_280 = vfmadd231pd_avx512f(auVar46,auVar7,auVar41);
  local_240 = vfmadd231pd_avx512f(auVar38,auVar8,auVar41);
  auVar38 = vmulpd_avx512f(auVar51,auVar40);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = local_4b8;
  auVar40 = vbroadcastsd_avx512f(auVar13);
  local_200 = vfmadd231pd_avx512f(auVar39,auVar6,auVar44);
  local_1c0 = vfmadd231pd_avx512f(auVar47,auVar7,auVar44);
  auVar38 = vfmadd231pd_avx512f(auVar38,auVar5,auVar42);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = local_4e8;
  auVar39 = vbroadcastsd_avx512f(auVar14);
  local_180 = vfmadd231pd_avx512f(auVar38,auVar8,auVar44);
  auVar49 = vmulpd_avx512f(auVar49,auVar39);
  auVar50 = vmulpd_avx512f(auVar50,auVar39);
  auVar51 = vmulpd_avx512f(auVar51,auVar39);
  auVar49 = vfmadd231pd_avx512f(auVar49,auVar43,auVar3);
  auVar50 = vfmadd231pd_avx512f(auVar50,auVar43,auVar4);
  auVar51 = vfmadd231pd_avx512f(auVar51,auVar5,auVar43);
  local_140 = vfmadd231pd_avx512f(auVar49,auVar40,auVar6);
  local_100 = vfmadd231pd_avx512f(auVar50,auVar40,auVar7);
  local_c0 = vfmadd231pd_avx512f(auVar51,auVar8,auVar40);
  local_4a8 = (Matrix<double,_3,_3,_1,_3,_3> *)(local_740 + 0x248);
  CalcCoordMatrix(this,(Matrix3xN *)(local_740 + 0x240));
  local_740._0_8_ = (_func_int **)0x3ff0000000000000;
  local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] =
       0.0;
  local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       0.0;
  local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] =
       0.0;
  local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
       0.0;
  local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] =
       0.0;
  local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] =
       0.0;
  local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] =
       0.0;
  local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] =
       0.0;
  local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] =
       0.0;
  Eigen::internal::
  generic_product_impl<Eigen::Matrix<double,3,24,1,3,24>,Eigen::Matrix<double,24,3,0,24,3>,Eigen::DenseShape,Eigen::DenseShape,8>
  ::scaleAndAddTo<Eigen::Matrix<double,3,3,0,3,3>>
            (&local_8c0,(Matrix3xN *)(local_740 + 0x240),(MatrixNx3c *)local_2c0,(Scalar *)local_740
            );
  auVar26._8_8_ =
       local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [3];
  auVar26._0_8_ =
       local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [2];
  auVar62._8_8_ = 0;
  auVar62._0_8_ =
       local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8];
  auVar60._8_8_ = 0;
  auVar60._0_8_ =
       local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [5];
  auVar35 = vunpcklpd_avx(auVar26,auVar60);
  auVar56._0_8_ =
       auVar35._0_8_ * auVar35._0_8_ +
       local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [0] * local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[0] +
       local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [1] * local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[1];
  auVar56._8_8_ =
       auVar35._8_8_ * auVar35._8_8_ +
       local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [3] * local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[3] +
       local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [4] * local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[4];
  auVar18._8_8_ = 0xbff0000000000000;
  auVar18._0_8_ = 0xbff0000000000000;
  auVar35 = vaddpd_avx512vl(auVar56,auVar18);
  auVar19._8_8_ = 0x3fe0000000000000;
  auVar19._0_8_ = 0x3fe0000000000000;
  local_8e0._0_16_ = vmulpd_avx512vl(auVar35,auVar19);
  dVar52 = local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[5] *
           local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[8] +
           local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[3] *
           local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[6] +
           local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[4] *
           local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[7];
  auVar35 = vunpcklpd_avx(auVar62,auVar60);
  auVar20._8_8_ =
       local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [2];
  auVar20._0_8_ =
       local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [2];
  auVar35 = vmulpd_avx512vl(auVar35,auVar20);
  auVar61._0_8_ =
       auVar35._0_8_ +
       local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [0] * local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[6] +
       local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [1] * local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[7];
  auVar61._8_8_ =
       auVar35._8_8_ +
       local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [0] * local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[3] +
       local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [1] * local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[4];
  auVar57._8_8_ = 0;
  auVar57._0_8_ = dVar52;
  auVar64._8_8_ = 0;
  auVar64._0_8_ =
       (local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[8] *
        local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[8] +
        local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[6] *
        local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[6] +
        local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[7] *
        local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[7] + -1.0) * 0.5;
  if (this->m_damping_enabled == true) {
    local_860 = auVar64;
    CalcCoordDerivMatrix(this,(Matrix3xN *)local_740);
    local_840.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0]
         = 0.0;
    local_840.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1]
         = 0.0;
    local_840.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2]
         = 0.0;
    local_840.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3]
         = 0.0;
    local_840.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4]
         = 0.0;
    local_840.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5]
         = 0.0;
    local_840.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6]
         = 0.0;
    local_840.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7]
         = 0.0;
    local_840.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8]
         = 0.0;
    local_848 = 1.0;
    Eigen::internal::
    generic_product_impl<Eigen::Matrix<double,3,24,1,3,24>,Eigen::Matrix<double,24,3,0,24,3>,Eigen::DenseShape,Eigen::DenseShape,8>
    ::scaleAndAddTo<Eigen::Matrix<double,3,3,0,3,3>>
              (&local_840,(Matrix3xN *)local_740,(Matrix<double,_24,_3,_0,_24,_3> *)local_2c0,
               &local_848);
    auVar28._8_8_ =
         local_840.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[3];
    auVar28._0_8_ =
         local_840.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[2];
    auVar66._8_8_ = 0;
    auVar66._0_8_ =
         local_840.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[5];
    auVar65._8_8_ = 0;
    auVar65._0_8_ =
         local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[5];
    auVar69._8_8_ = 0;
    auVar69._0_8_ =
         local_840.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[8];
    auVar68._8_8_ = 0;
    auVar68._0_8_ =
         local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[8];
    auVar35 = vunpcklpd_avx(auVar28,auVar66);
    auVar27._8_8_ =
         local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[3];
    auVar27._0_8_ =
         local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[2];
    auVar9 = vunpcklpd_avx(auVar27,auVar65);
    auVar58._0_8_ =
         local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[0] *
         local_840.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[0] +
         local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[1] *
         local_840.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[1] + auVar9._0_8_ * auVar35._0_8_;
    auVar58._8_8_ =
         local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[3] *
         local_840.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[3] +
         local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[4] *
         local_840.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[4] + auVar9._8_8_ * auVar35._8_8_;
    auVar63._8_8_ = this->m_Alpha;
    auVar63._0_8_ = this->m_Alpha;
    local_8e0._0_16_ = vfmadd231pd_fma(local_8e0._0_16_,auVar63,auVar58);
    auVar35 = vunpcklpd_avx(auVar69,auVar66);
    auVar21._8_8_ =
         local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[2];
    auVar21._0_8_ =
         local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[2];
    auVar36 = vmulpd_avx512vl(auVar35,auVar21);
    auVar15._8_8_ = 0;
    auVar15._0_8_ = local_860._0_8_;
    auVar67._8_8_ = 0;
    auVar67._0_8_ =
         local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[6] *
         local_840.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[6] +
         local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[7] *
         local_840.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[7] +
         local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[8] *
         local_840.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[8];
    auVar9 = vfmadd213sd_fma(auVar67,auVar63,auVar15);
    auVar35 = vunpcklpd_avx(auVar68,auVar65);
    auVar22._8_8_ =
         local_840.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[2];
    auVar22._0_8_ =
         local_840.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[2];
    auVar37 = vmulpd_avx512vl(auVar35,auVar22);
    auVar16._8_8_ = 0;
    auVar16._0_8_ = dVar52;
    auVar70._8_8_ = 0;
    auVar70._0_8_ =
         local_840.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[3] *
         local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[6] +
         local_840.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[4] *
         local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[7] +
         local_840.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[5] *
         local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[8] +
         local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[3] *
         local_840.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[6] +
         local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[4] *
         local_840.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[7] +
         local_840.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[8] *
         local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[5];
    auVar35 = vfmadd213sd_fma(auVar70,auVar63,auVar16);
    auVar53._0_8_ =
         local_840.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[0] *
         local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[6] +
         local_840.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[1] *
         local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[7] + auVar37._0_8_ +
         local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[0] *
         local_840.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[6] +
         local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[1] *
         local_840.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[7] + auVar36._0_8_;
    auVar53._8_8_ =
         local_840.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[0] *
         local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[3] +
         local_840.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[1] *
         local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[4] + auVar37._8_8_ +
         local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[0] *
         local_840.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[3] +
         local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[1] *
         local_840.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[4] + auVar36._8_8_;
    auVar61 = vfmadd231pd_fma(auVar61,auVar63,auVar53);
    local_900 = vunpcklpd_avx(auVar9,auVar35);
  }
  else {
    local_900 = vunpcklpd_avx(auVar64,auVar57);
  }
  pLVar34 = (this->m_layers).
            super__Vector_base<chrono::fea::ChElementShellANCF_3833::Layer,_Eigen::aligned_allocator<chrono::fea::ChElementShellANCF_3833::Layer>_>
            ._M_impl.super__Vector_impl_data._M_start;
  lVar17 = (long)pLVar34[lVar33].m_material.
                 super___shared_ptr<chrono::fea::ChMaterialShellANCF,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
  this_00 = (ChElementShellANCF_3833 *)
            pLVar34[lVar33].m_material.
            super___shared_ptr<chrono::fea::ChMaterialShellANCF,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 == (ChElementShellANCF_3833 *)0x0) {
    this_00 = (ChElementShellANCF_3833 *)local_740;
    memcpy(this_00,(void *)(lVar17 + 0x20),0x120);
  }
  else {
    if (__libc_single_threaded == '\0') {
      LOCK();
      pCVar31 = (ChKblockGeneric *)
                ((long)&(this_00->super_ChElementShell).super_ChElementGeneric + 8);
      *(int *)&(pCVar31->super_ChKblock)._vptr_ChKblock =
           *(int *)&(pCVar31->super_ChKblock)._vptr_ChKblock + 1;
      UNLOCK();
    }
    else {
      pCVar31 = (ChKblockGeneric *)
                ((long)&(this_00->super_ChElementShell).super_ChElementGeneric + 8);
      *(int *)&(pCVar31->super_ChKblock)._vptr_ChKblock =
           *(int *)&(pCVar31->super_ChKblock)._vptr_ChKblock + 1;
    }
    memcpy(local_740,(void *)(lVar17 + 0x20),0x120);
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
    pLVar34 = (this->m_layers).
              super__Vector_base<chrono::fea::ChElementShellANCF_3833::Layer,_Eigen::aligned_allocator<chrono::fea::ChElementShellANCF_3833::Layer>_>
              ._M_impl.super__Vector_impl_data._M_start;
  }
  RotateReorderStiffnessMatrix
            (this_00,(ChMatrixNM<double,_6,_6> *)local_740,pLVar34[lVar33].m_theta);
  local_8f0 = auVar61._0_8_;
  dStack_8e8 = auVar61._8_8_;
  pdVar32 = (double *)(local_740 + 0x20);
  lVar33 = 0;
  do {
    pdVar1 = pdVar32 + -2;
    pdVar23 = pdVar32 + -1;
    dVar52 = *pdVar32;
    pdVar24 = pdVar32 + 1;
    pdVar2 = pdVar32 + -4;
    pdVar25 = pdVar32 + -3;
    pdVar32 = pdVar32 + 6;
    dVar52 = (double)local_8e0._0_8_ * *pdVar2 +
             (double)local_900._0_8_ * *pdVar1 + local_8f0 * dVar52;
    dVar55 = (double)local_8e0._8_8_ * *pdVar25 +
             (double)local_900._8_8_ * *pdVar23 + dStack_8e8 * *pdVar24;
    auVar54._0_8_ = dVar52 + dVar55;
    auVar54._8_8_ = dVar52 + dVar55;
    dVar52 = (double)vmovlpd_avx(auVar54);
    local_840.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
    [lVar33] = dVar52;
    lVar33 = lVar33 + 1;
  } while (lVar33 != 6);
  auVar30._8_8_ =
       local_840.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [5];
  auVar30._0_8_ =
       local_840.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [4];
  auVar59._8_8_ =
       local_840.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [2];
  auVar59._0_8_ =
       local_840.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [2];
  auVar59._16_8_ =
       local_840.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [2];
  auVar59._24_8_ =
       local_840.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [2];
  (__return_storage_ptr__->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       local_840.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [0];
  (__return_storage_ptr__->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       local_840.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [1];
  auVar29._8_8_ =
       local_840.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [4];
  auVar29._0_8_ =
       local_840.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [3];
  auVar35 = vunpcklpd_avx(auVar29,auVar30);
  auVar59 = vblendpd_avx(ZEXT1632(auVar35),auVar59,8);
  auVar59 = vpermpd_avx2(auVar59,0xc4);
  *(undefined1 (*) [32])
   ((__return_storage_ptr__->super_Matrix<double,_3,_3,_1,_3,_3>).
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 5) =
       auVar59;
  auVar35 = vshufpd_avx(auVar30,auVar30,1);
  *(undefined1 (*) [16])
   ((__return_storage_ptr__->super_Matrix<double,_3,_3,_1,_3,_3>).
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 1) =
       auVar35;
  (__return_storage_ptr__->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
       local_840.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [5];
  return __return_storage_ptr__;
}

Assistant:

ChMatrix33<> ChElementShellANCF_3833::GetPK2Stress(const double layer,
                                                   const double xi,
                                                   const double eta,
                                                   const double layer_zeta) {
    MatrixNx3c Sxi_D;  // Matrix of normalized shape function derivatives
    double layer_midsurface_offset =
        -m_thicknessZ / 2 + m_layer_zoffsets[layer] + m_layers[layer].Get_thickness() / 2 + m_midsurfoffset;
    Calc_Sxi_D(Sxi_D, xi, eta, layer_zeta, m_layers[layer].Get_thickness(), layer_midsurface_offset);

    ChMatrix33<double> J_0xi;  // Element Jacobian between the reference configuration and normalized configuration
    J_0xi.noalias() = m_ebar0 * Sxi_D;

    Sxi_D = Sxi_D * J_0xi.inverse();  // Adjust the shape function derivative matrix to account for the potentially
                                      // distorted reference configuration

    Matrix3xN e_bar;  // Element coordinates in matrix form
    CalcCoordMatrix(e_bar);

    // Calculate the Deformation Gradient at the current point
    ChMatrixNMc<double, 3, 3> F = e_bar * Sxi_D;

    // Calculate the Green-Lagrange strain tensor at the current point in Voigt notation
    ChVectorN<double, 6> epsilon_combined;
    epsilon_combined(0) = 0.5 * (F.col(0).dot(F.col(0)) - 1);
    epsilon_combined(1) = 0.5 * (F.col(1).dot(F.col(1)) - 1);
    epsilon_combined(2) = 0.5 * (F.col(2).dot(F.col(2)) - 1);
    epsilon_combined(3) = F.col(1).dot(F.col(2));
    epsilon_combined(4) = F.col(0).dot(F.col(2));
    epsilon_combined(5) = F.col(0).dot(F.col(1));

    if (m_damping_enabled) {
        Matrix3xN ebardot;  // Element coordinate time derivatives in matrix form
        CalcCoordDerivMatrix(ebardot);

        // Calculate the time derivative of the Deformation Gradient at the current point
        ChMatrixNMc<double, 3, 3> Fdot = ebardot * Sxi_D;

        // Calculate the time derivative of the Green-Lagrange strain tensor in Voigt notation
        // and combine it with epsilon assuming a Linear Kelvin-Voigt Viscoelastic material model
        epsilon_combined(0) += m_Alpha * F.col(0).dot(Fdot.col(0));
        epsilon_combined(1) += m_Alpha * F.col(1).dot(Fdot.col(1));
        epsilon_combined(2) += m_Alpha * F.col(2).dot(Fdot.col(2));
        epsilon_combined(3) += m_Alpha * (F.col(1).dot(Fdot.col(2)) + Fdot.col(1).dot(F.col(2)));
        epsilon_combined(4) += m_Alpha * (F.col(0).dot(Fdot.col(2)) + Fdot.col(0).dot(F.col(2)));
        epsilon_combined(5) += m_Alpha * (F.col(0).dot(Fdot.col(1)) + Fdot.col(0).dot(F.col(1)));
    }

    // Get the stiffness tensor in 6x6 matrix form for the current layer and rotate it in the midsurface according
    // to the user specified angle.  Note that the matrix is reordered as well to match the Voigt notation used in
    // this element compared to what is used in ChMaterialShellANCF

    ChMatrixNM<double, 6, 6> D = m_layers[layer].GetMaterial()->Get_E_eps();
    RotateReorderStiffnessMatrix(D, m_layers[layer].Get_theta());

    ChVectorN<double, 6> sigmaPK2 = D * epsilon_combined;  // 2nd Piola Kirchhoff Stress tensor in Voigt notation

    ChMatrix33<> SPK2;
    SPK2(0, 0) = sigmaPK2(0);
    SPK2(1, 1) = sigmaPK2(1);
    SPK2(2, 2) = sigmaPK2(2);
    SPK2(1, 2) = sigmaPK2(3);
    SPK2(2, 1) = sigmaPK2(3);
    SPK2(0, 2) = sigmaPK2(4);
    SPK2(2, 0) = sigmaPK2(4);
    SPK2(0, 1) = sigmaPK2(5);
    SPK2(1, 0) = sigmaPK2(5);

    return SPK2;
}